

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetTargetRGBA(GPU_Target *target,Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  bool local_19;
  SDL_Color local_18;
  SDL_Color c;
  Uint8 a_local;
  Uint8 b_local;
  Uint8 g_local;
  Uint8 r_local;
  GPU_Target *target_local;
  
  local_18.g = g;
  local_18.r = r;
  local_18.b = b;
  local_18.a = a;
  if (target != (GPU_Target *)0x0) {
    local_19 = false;
    if (((r == 0xff) && (local_19 = false, g == 0xff)) && (local_19 = false, b == 0xff)) {
      local_19 = a == 0xff;
    }
    target->use_color = (_Bool)((local_19 ^ 0xffU) & 1);
    target->color = local_18;
  }
  return;
}

Assistant:

void GPU_SetTargetRGBA(GPU_Target* target, Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = a;

    if(target == NULL)
        return;

    target->use_color = !(r == 255 && g == 255 && b == 255 && a == 255);
    target->color = c;
}